

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

string * __thiscall rcg::Buffer::getTLType_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  element_type *peVar1;
  BUFFER_HANDLE pvVar2;
  char *pcVar3;
  GC_ERROR GVar4;
  void *pvVar5;
  INFO_DATATYPE type;
  char tmp [1024];
  int local_434;
  size_t local_430;
  char local_428 [1024];
  
  pvVar5 = Stream::getHandle(this->parent);
  peVar1 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar2 = this->buffer;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memset(local_428,0,0x400);
  local_430 = 0x400;
  if (pvVar2 != (BUFFER_HANDLE)0x0 && pvVar5 != (void *)0x0) {
    GVar4 = (*peVar1->DSGetBufferInfo)(pvVar5,pvVar2,8,&local_434,local_428,&local_430);
    if ((GVar4 == 0) && (local_434 == 1)) {
      pcVar3 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(local_428);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar3,(ulong)local_428);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Buffer::getTLType() const
{
  return getBufferString(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_TLTYPE);
}